

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O2

void Assimp::FBX::anon_unknown_3::TokenizeError(string *message,size_t offset)

{
  DeadlyImportError *this;
  allocator local_61;
  string local_60;
  string local_40;
  
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_60,"FBX-Tokenize",&local_61);
  Util::AddOffset(&local_40,&local_60,message,offset);
  DeadlyImportError::DeadlyImportError(this,&local_40);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void TokenizeError(const std::string& message, size_t offset)
{
    throw DeadlyImportError(Util::AddOffset("FBX-Tokenize",message,offset));
}